

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeoutMonitor.cpp
# Opt level: O1

void __thiscall helics::TimeoutMonitor::tick(TimeoutMonitor *this,CommonCore *core)

{
  GlobalFederateId federateID;
  int iVar1;
  long lVar2;
  string_view message_00;
  bool bVar3;
  long lVar4;
  string *psVar5;
  rep rVar6;
  long lVar7;
  string_view message_01;
  string_view name;
  string message;
  ActionMessage png;
  long *local_108;
  size_t local_100;
  long local_f8 [2];
  size_t local_e8;
  long *plStack_e0;
  ActionMessage local_d8;
  
  if ((this->parentConnection).waitingForPingReply == true) {
    lVar4 = std::chrono::_V2::steady_clock::now();
    lVar4 = lVar4 - (this->parentConnection).lastPing.__d.__r;
    lVar2 = (this->timeout).__r;
    lVar7 = lVar2 * 1000000;
    if (lVar4 != lVar7 && SBORROW8(lVar4,lVar7) == lVar4 + lVar2 * -1000000 < 0) {
      local_108 = local_f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"core lost connection with broker","");
      federateID.gid = (core->super_BrokerBase).global_broker_id_local.gid;
      psVar5 = CommonCore::getIdentifier_abi_cxx11_(core);
      local_e8 = local_100;
      plStack_e0 = local_108;
      message_00._M_str = (char *)local_108;
      message_00._M_len = local_100;
      name._M_str = (psVar5->_M_dataplus)._M_p;
      name._M_len = psVar5->_M_string_length;
      BrokerBase::sendToLogger(&core->super_BrokerBase,federateID,0,name,message_00,false);
      message_01._M_str = (char *)local_108;
      message_01._M_len = local_100;
      CommonCore::sendErrorToFederates(core,-5,message_01);
      LOCK();
      (core->super_BrokerBase).brokerState._M_i = ERRORED;
      UNLOCK();
      CommonCore::sendDisconnect(core,cmd_stop);
      ActionMessage::ActionMessage(&local_d8,cmd_stop);
      BrokerBase::addActionMessage(&core->super_BrokerBase,&local_d8);
      ActionMessage::~ActionMessage(&local_d8);
      if (local_108 == local_f8) {
        return;
      }
      operator_delete(local_108,local_f8[0] + 1);
      return;
    }
    ActionMessage::ActionMessage(&local_d8,cmd_ping_priority);
    local_d8.source_id.gid = (core->super_BrokerBase).global_broker_id_local.gid;
    local_d8.dest_id.gid = (core->super_BrokerBase).higher_broker_id.gid;
    (*(core->super_Core)._vptr_Core[0x6b])(core,0,&local_d8);
  }
  else {
    bVar3 = CommonCore::isConnected(core);
    if ((((bVar3) &&
         (iVar1 = (core->super_BrokerBase).global_broker_id_local.gid, iVar1 != -2010000000)) &&
        (iVar1 != -1700000000)) && (iVar1 != 0)) {
      iVar1 = (core->super_BrokerBase).higher_broker_id.gid;
      if (iVar1 == -2010000000) {
        return;
      }
      if (iVar1 == -1700000000) {
        return;
      }
      ActionMessage::ActionMessage(&local_d8,cmd_ping_priority);
      local_d8.source_id.gid = (core->super_BrokerBase).global_broker_id_local.gid;
      local_d8.dest_id.gid = (core->super_BrokerBase).higher_broker_id.gid;
      (*(core->super_Core)._vptr_Core[0x6b])(core,0,&local_d8);
      rVar6 = std::chrono::_V2::steady_clock::now();
      (this->parentConnection).lastPing.__d.__r = rVar6;
      (this->parentConnection).waitingForPingReply = true;
    }
    else {
      bVar3 = CommonCore::isConnected(core);
      if ((bVar3) &&
         (((iVar1 = (core->super_BrokerBase).global_broker_id_local.gid, iVar1 == -2010000000 ||
           (iVar1 == 0)) || (iVar1 == -1700000000)))) {
        ActionMessage::ActionMessage(&local_d8,cmd_resend);
        local_d8.messageID = -0x10000028;
        CommonCore::processCommand(core,&local_d8);
      }
      else if (((core->super_BrokerBase).brokerState._M_i == TERMINATED) ||
              ((core->super_BrokerBase).brokerState._M_i == ERRORED)) {
        if (this->waitingForConnection != true) goto LAB_0031c6d9;
        lVar4 = std::chrono::_V2::steady_clock::now();
        lVar4 = lVar4 - (this->startWaiting).__d.__r;
        lVar2 = (this->timeout).__r;
        lVar7 = lVar2 * 1000000;
        if (lVar4 == lVar7 || SBORROW8(lVar4,lVar7) != lVar4 + lVar2 * -1000000 < 0) {
          return;
        }
        ActionMessage::ActionMessage(&local_d8,cmd_check_connections);
        local_d8.source_id.gid = (core->super_BrokerBase).global_broker_id_local.gid;
        BrokerBase::addActionMessage(&core->super_BrokerBase,&local_d8);
      }
      else {
        if (this->waitingForConnection != true) {
LAB_0031c6d9:
          this->waitingForConnection = true;
          rVar6 = std::chrono::_V2::steady_clock::now();
          (this->startWaiting).__d.__r = rVar6;
          return;
        }
        lVar4 = std::chrono::_V2::steady_clock::now();
        lVar4 = lVar4 - (this->startWaiting).__d.__r;
        lVar2 = (this->timeout).__r;
        lVar7 = lVar2 * 1000000;
        if (lVar4 == lVar7 || SBORROW8(lVar4,lVar7) != lVar4 + lVar2 * -1000000 < 0) {
          return;
        }
        ActionMessage::ActionMessage(&local_d8,cmd_check_connections);
        local_d8.source_id.gid = (core->super_BrokerBase).global_broker_id_local.gid;
        BrokerBase::addActionMessage(&core->super_BrokerBase,&local_d8);
      }
    }
  }
  ActionMessage::~ActionMessage(&local_d8);
  return;
}

Assistant:

void TimeoutMonitor::tick(CommonCore* core)
{
    if (parentConnection.waitingForPingReply) {
        auto now = std::chrono::steady_clock::now();
        if (now - parentConnection.lastPing > timeout) {
            // try to reset the connection to the broker
            // brokerReconnect()
            const std::string message{"core lost connection with broker"};
            core->sendToLogger(core->global_broker_id_local,
                               LogLevels::ERROR_LEVEL,
                               core->getIdentifier(),
                               message);
            core->sendErrorToFederates(-5, message);
            core->brokerState = BrokerBase::BrokerState::ERRORED;
            core->sendDisconnect();
            core->addActionMessage(CMD_STOP);
        } else {  // ping again
            ActionMessage png(CMD_PING_PRIORITY);
            png.source_id = core->global_broker_id_local;
            png.dest_id = core->higher_broker_id;
            core->transmit(parent_route_id, png);
        }
    } else if ((core->isConnected()) && (core->global_broker_id_local.isValid()) &&
               (core->global_broker_id_local != parent_broker_id)) {
        // if (allFedWaiting())
        //{
        if (core->higher_broker_id.isValid()) {
            ActionMessage png(CMD_PING_PRIORITY);
            png.source_id = core->global_broker_id_local;
            png.dest_id = core->higher_broker_id;
            core->transmit(parent_route_id, png);
            parentConnection.lastPing = std::chrono::steady_clock::now();
            parentConnection.waitingForPingReply = true;
        }
        //}
    } else if ((core->isConnected()) &&
               ((!core->global_broker_id_local.isValid()) ||
                (core->global_broker_id_local == parent_broker_id))) {
        ActionMessage rsend(CMD_RESEND);
        rsend.messageID = static_cast<int32_t>(CMD_REG_BROKER);
        core->processCommand(std::move(rsend));
    } else if ((core->brokerState == BrokerBase::BrokerState::TERMINATED) ||
               (core->brokerState == BrokerBase::BrokerState::ERRORED)) {
        if (waitingForConnection) {
            auto now = std::chrono::steady_clock::now();
            if (now - startWaiting > timeout) {
                ActionMessage png(CMD_CHECK_CONNECTIONS);
                png.source_id = core->global_broker_id_local;
                core->addActionMessage(png);
            }
        } else {
            waitingForConnection = true;
            startWaiting = std::chrono::steady_clock::now();
        }
    } else {
        if (waitingForConnection) {
            auto now = std::chrono::steady_clock::now();
            if (now - startWaiting > timeout) {
                ActionMessage png(CMD_CHECK_CONNECTIONS);
                png.source_id = core->global_broker_id_local;
                core->addActionMessage(png);
            }
        } else {
            waitingForConnection = true;
            startWaiting = std::chrono::steady_clock::now();
        }
    }
}